

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sim.cc
# Opt level: O0

void __thiscall sim_array_access_Test::TestBody(sim_array_access_Test *this)

{
  bool bVar1;
  int iVar2;
  Generator *pGVar3;
  Var *pVVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar5;
  unsigned_long *puVar6;
  undefined4 extraout_var_01;
  char *in_R9;
  optional<unsigned_long> value_00;
  shared_ptr<kratos::Var> sVar7;
  optional<unsigned_long> oVar8;
  AssertHelper local_478;
  Message local_470;
  int local_464;
  undefined1 local_460 [8];
  AssertionResult gtest_ar_1;
  undefined7 uStack_447;
  AssertHelper local_440;
  Message local_438;
  undefined1 local_430 [8];
  AssertionResult gtest_ar;
  AssertHelper local_400;
  Message local_3f8;
  bool local_3e9;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_;
  _Storage<unsigned_long,_true> _Stack_3c8;
  optional<unsigned_long> res;
  undefined1 local_3b0;
  undefined3 uStack_3af;
  enable_shared_from_this<kratos::Var> local_3a8;
  unsigned_long local_398;
  undefined1 local_390 [12];
  uint local_37c;
  undefined1 local_378 [4];
  uint32_t value;
  Simulator sim;
  string local_1c8;
  Var *local_1a8;
  Var *b;
  string local_198;
  Var *local_178;
  Var *a;
  allocator<char> local_159;
  string local_158;
  Generator *local_138;
  Generator *mod;
  Context context;
  sim_array_access_Test *this_local;
  
  context.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)this;
  kratos::Context::Context((Context *)&mod);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"mod",&local_159);
  pGVar3 = kratos::Context::generator((Context *)&mod,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  local_138 = pGVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"a",(allocator<char> *)((long)&b + 7));
  pVVar4 = kratos::Generator::var(pGVar3,&local_198,4,4);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)((long)&b + 7));
  pGVar3 = local_138;
  local_178 = pVVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"b",(allocator<char> *)((long)&sim.simulation_depth_ + 7));
  pVVar4 = kratos::Generator::var(pGVar3,&local_1c8,2);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&sim.simulation_depth_ + 7));
  local_1a8 = pVVar4;
  kratos::Simulator::Simulator((Simulator *)local_378,local_138);
  pVVar4 = local_1a8;
  local_37c = 5;
  local_398 = 2;
  std::optional<unsigned_long>::optional<unsigned_long,_true>
            ((optional<unsigned_long> *)local_390,&local_398);
  oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._12_4_ = 0;
  oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       (_Storage<unsigned_long,_true>)local_390._0_8_;
  oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_390[8];
  oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_3_ = local_390._9_3_;
  kratos::Simulator::set((Simulator *)local_378,pVVar4,oVar8,true);
  pVVar4 = local_178;
  sVar7 = std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_3a8);
  iVar2 = (*(pVVar4->super_IRNode)._vptr_IRNode[10])
                    (pVVar4,&local_3a8,
                     sVar7.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi._M_pi);
  std::optional<unsigned_long>::optional<const_unsigned_int_&,_true>
            ((optional<unsigned_long> *)
             &res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged,&local_37c);
  value_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._12_4_ = 0;
  value_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       (_Storage<unsigned_long,_true>)
       res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._8_8_;
  value_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_3b0;
  value_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_3_ = uStack_3af;
  kratos::Simulator::set((Simulator *)local_378,(Var *)CONCAT44(extraout_var,iVar2),value_00,true);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_3a8);
  pVVar4 = local_178;
  sVar7 = std::enable_shared_from_this<kratos::Var>::shared_from_this
                    ((enable_shared_from_this<kratos::Var> *)&gtest_ar_.message_);
  iVar2 = (*(pVVar4->super_IRNode)._vptr_IRNode[10])
                    (pVVar4,&gtest_ar_.message_,
                     sVar7.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi._M_pi);
  oVar8 = kratos::Simulator::get((Simulator *)local_378,(Var *)CONCAT44(extraout_var_00,iVar2));
  _Stack_3c8._M_value =
       oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&gtest_ar_.message_);
  local_3e9 = std::operator!=(&_Stack_3c8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3e8,&local_3e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
  if (!bVar1) {
    testing::Message::Message(&local_3f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_3e8,
               (AssertionResult *)"res != std::nullopt","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_400,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x81,pcVar5);
    testing::internal::AssertHelper::operator=(&local_400,&local_3f8);
    testing::internal::AssertHelper::~AssertHelper(&local_400);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_3f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
  puVar6 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&_Stack_3c8);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_430,"*res","value",puVar6,&local_37c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
  if (!bVar1) {
    testing::Message::Message(&local_438);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_430);
    testing::internal::AssertHelper::AssertHelper
              (&local_440,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x82,pcVar5);
    testing::internal::AssertHelper::operator=(&local_440,&local_438);
    testing::internal::AssertHelper::~AssertHelper(&local_440);
    testing::Message::~Message(&local_438);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
  iVar2 = (*(local_178->super_IRNode)._vptr_IRNode[9])(local_178,2);
  oVar8 = kratos::Simulator::get((Simulator *)local_378,(Var *)CONCAT44(extraout_var_01,iVar2));
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._1_7_ = uStack_447;
  res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  _Stack_3c8._M_value =
       (unsigned_long)
       gtest_ar_1.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  puVar6 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&_Stack_3c8);
  local_464 = 5;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_460,"*res","5",puVar6,&local_464);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_460);
  if (!bVar1) {
    testing::Message::Message(&local_470);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_460);
    testing::internal::AssertHelper::AssertHelper
              (&local_478,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x84,pcVar5);
    testing::internal::AssertHelper::operator=(&local_478,&local_470);
    testing::internal::AssertHelper::~AssertHelper(&local_478);
    testing::Message::~Message(&local_470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
  kratos::Simulator::~Simulator((Simulator *)local_378);
  kratos::Context::~Context((Context *)&mod);
  return;
}

Assistant:

TEST(sim, array_access) {   // NOLINT
    Context context;
    auto &mod = context.generator("mod");
    auto &a = mod.var("a", 4, 4);
    auto &b = mod.var("b", 2);

    Simulator sim(&mod);
    uint32_t constexpr value = 5;
    sim.set(&b, 2ul);
    sim.set(&a[b.shared_from_this()], value);

    auto res = sim.get(&a[b.shared_from_this()]);
    EXPECT_TRUE(res != std::nullopt);
    EXPECT_EQ(*res, value);
    res = sim.get(&a[2]);
    EXPECT_EQ(*res, 5);
}